

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O3

int main(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  Shape *pSVar2;
  string_view name;
  string_view name_00;
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  h;
  t_type_info<Square> ret;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_80;
  type_info local_60;
  
  local_80.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_80.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_80.m_registered_types.
  super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_60.super_type_info.destroy = (v_pv_f)0x0;
  local_60.super_type_info.default_construct_at = (v_pv_f)0x0;
  local_60.super_type_info.alloc_and_construct = (pv_v_f)0x0;
  local_60.super_type_info.name._M_len = 2;
  local_60.super_type_info.name._M_str = "sq";
  local_60.super_type_info.size = 0x30;
  local_60.super_type_info.alignment = 8;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Square>(&local_80,(t_type_info<Square> *)&local_60);
  local_60.super_type_info.default_construct_at = (v_pv_f)0x0;
  local_60.super_type_info.alloc_and_construct = (pv_v_f)0x0;
  local_60.super_type_info.destroy = (v_pv_f)0x0;
  local_60.super_type_info.name._M_len = 2;
  local_60.super_type_info.name._M_str = "ci";
  local_60.super_type_info.size = 0x30;
  local_60.super_type_info.alignment = 8;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::register_type<Circle>(&local_80,(t_type_info<Circle> *)&local_60);
  paVar1 = &local_a0.field_2;
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"asd","");
  name._M_str = "sq";
  name._M_len = 2;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::find_type_info(&local_60,&local_80,name);
  if (local_60.super_type_info.name._M_len == 0) {
    pSVar2 = (Shape *)0x0;
  }
  else {
    pSVar2 = (*local_60.alloc_and_construct_a)(&local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  (*pSVar2->_vptr_Shape[1])(pSVar2,&std::cout);
  local_a0._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_a0,"cici","");
  name_00._M_str = "ci";
  name_00._M_len = 2;
  trex::
  hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::find_type_info(&local_60,&local_80,name_00);
  if (local_60.super_type_info.name._M_len == 0) {
    pSVar2 = (Shape *)0x0;
  }
  else {
    pSVar2 = (*local_60.alloc_and_construct_a)(&local_a0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != paVar1) {
    operator_delete(local_a0._M_dataplus._M_p,local_a0.field_2._M_allocated_capacity + 1);
  }
  (*pSVar2->_vptr_Shape[1])(pSVar2,&std::cout);
  if (local_80.m_registered_types.
      super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_80.m_registered_types.
                    super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_80.m_registered_types.
                          super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_80.m_registered_types.
                          super__Vector_base<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info,_std::allocator<trex::hierarchy<Shape,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::type_info>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main()
{
    trex::hierarchy<Shape, std::string> h;
    h.register_type(trex::make_type_info<Square>("sq"));
    h.register_type(trex::make_type_info<Circle>("ci"));

    auto c = h.alloc_and_construct("sq", "asd");
    c->log(std::cout);

    c = h.alloc_and_construct("ci", "cici");
    c->log(std::cout);

    return 0;
}